

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::udp_tracker_connection::send_udp_announce(udp_tracker_connection *this)

{
  undefined1 *puVar1;
  event_t eVar2;
  ushort uVar3;
  uint32_t uVar4;
  session_settings *this_00;
  address *__s;
  uint uVar5;
  int iVar6;
  int iVar7;
  long val;
  iterator iVar8;
  long lVar9;
  string *psVar10;
  int *piVar11;
  ulong uVar12;
  byte bVar13;
  long lVar14;
  error_code *peVar15;
  long val_2;
  char *pcVar16;
  size_t __n;
  ulong uVar17;
  char cVar18;
  address *__cp;
  error_code *in_R8;
  size_type sVar19;
  uint val_6;
  string_view url;
  span<const_char> in;
  span<const_char> p;
  string request_string;
  error_code ec;
  shared_ptr<libtorrent::aux::request_callback> cb;
  address ip;
  time_type local_3d0;
  wait_op *local_3c0 [2];
  per_timer_data **local_3b0;
  per_timer_data *local_3a0 [4];
  void *local_380 [3];
  aux *local_368;
  _Alloc_hider local_360;
  char buf [800];
  
  if (this->m_abort != false) {
    return;
  }
  if ((this->m_target).impl_.data_.base.sa_family == 2) {
    ip._0_8_ = (ulong)(this->m_target).impl_.data_.v6.sin6_flowinfo << 0x20;
    ip.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    ip.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    ip.ipv6_address_.scope_id_ = 0;
  }
  else {
    ip.ipv6_address_.addr_.__in6_u._0_8_ = *(undefined8 *)((long)&(this->m_target).impl_.data_ + 8);
    ip.ipv6_address_.addr_.__in6_u._8_8_ =
         *(undefined8 *)((long)&(this->m_target).impl_.data_ + 0x10);
    ip.ipv6_address_.scope_id_ = (unsigned_long)(this->m_target).impl_.data_.v6.sin6_scope_id;
    ip.type_ = ipv6;
    ip.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
  }
  this_00 = ((this->super_tracker_connection).m_man)->m_settings;
  iVar8 = ::std::
          _Rb_tree<boost::asio::ip::address,_std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>,_std::_Select1st<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
          ::find((_Rb_tree<boost::asio::ip::address,_std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>,_std::_Select1st<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
                  *)m_connection_cache,&ip);
  if (iVar8._M_node == (_Base_ptr)(m_connection_cache + 8)) {
    return;
  }
  local_360._M_p = (pointer)&this->m_target;
  lVar9 = *(long *)(iVar8._M_node + 2);
  lVar14 = 0x38;
  pcVar16 = buf;
  do {
    *pcVar16 = (char)(lVar9 >> ((byte)lVar14 & 0x3f));
    lVar14 = lVar14 + -8;
    pcVar16 = pcVar16 + 1;
  } while (lVar14 != -8);
  bVar13 = 0x18;
  lVar9 = 8;
  do {
    buf[lVar9] = (char)(1 >> (bVar13 & 0x1f));
    bVar13 = bVar13 - 8;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0xc);
  uVar4 = this->m_transaction_id;
  bVar13 = 0x18;
  lVar9 = 0xc;
  do {
    buf[lVar9] = (char)((int)uVar4 >> (bVar13 & 0x1f));
    bVar13 = bVar13 - 8;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10);
  local_368 = (aux *)&(this->super_tracker_connection).m_req.info_hash;
  buf._32_4_ = (this->super_tracker_connection).m_req.info_hash.m_number._M_elems[4];
  pcVar16 = buf + 0x38;
  buf._16_8_ = *(undefined8 *)(this->super_tracker_connection).m_req.info_hash.m_number._M_elems;
  buf._24_8_ = *(undefined8 *)
                ((this->super_tracker_connection).m_req.info_hash.m_number._M_elems + 2);
  buf._52_4_ = (this->super_tracker_connection).m_req.pid.m_number._M_elems[4];
  buf._36_8_ = *(undefined8 *)(this->super_tracker_connection).m_req.pid.m_number._M_elems;
  buf._44_8_ = *(undefined8 *)((this->super_tracker_connection).m_req.pid.m_number._M_elems + 2);
  lVar9 = (this->super_tracker_connection).m_req.downloaded;
  lVar14 = 0x38;
  do {
    *pcVar16 = (char)(lVar9 >> ((byte)lVar14 & 0x3f));
    lVar14 = lVar14 + -8;
    pcVar16 = pcVar16 + 1;
  } while (lVar14 != -8);
  pcVar16 = buf + 0x40;
  lVar9 = (this->super_tracker_connection).m_req.left;
  lVar14 = 0x38;
  do {
    *pcVar16 = (char)(lVar9 >> ((byte)lVar14 & 0x3f));
    lVar14 = lVar14 + -8;
    pcVar16 = pcVar16 + 1;
  } while (lVar14 != -8);
  pcVar16 = buf + 0x48;
  lVar9 = (this->super_tracker_connection).m_req.uploaded;
  lVar14 = 0x38;
  do {
    *pcVar16 = (char)(lVar9 >> ((byte)lVar14 & 0x3f));
    lVar14 = lVar14 + -8;
    pcVar16 = pcVar16 + 1;
  } while (lVar14 != -8);
  eVar2 = (this->super_tracker_connection).m_req.event;
  bVar13 = 0x18;
  lVar9 = 0x50;
  do {
    buf[lVar9] = eVar2 >> (bVar13 & 0x1f);
    bVar13 = bVar13 - 8;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x54);
  ip._0_8_ = &this_00->m_mutex;
  ip.ipv6_address_.addr_.__in6_u._0_8_ = ip.ipv6_address_.addr_.__in6_u._0_8_ & 0xffffffffffffff00;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&ip);
  ip.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = 1;
  uVar17 = (this_00->m_store).m_bools.super__Base_bitset<2UL>._M_w[0];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&ip);
  uVar5 = 0;
  if (((uVar17 >> 0x26 & 1) != 0) ||
     (psVar10 = session_settings::get_str_abi_cxx11_(this_00,1), uVar5 = 0,
     psVar10->_M_string_length == 0)) goto LAB_0038b349;
  psVar10 = session_settings::get_str_abi_cxx11_(this_00,1);
  __s = (address *)(psVar10->_M_dataplus)._M_p;
  piVar11 = __errno_location();
  *piVar11 = 0;
  pcVar16 = strchr((char *)__s,0x25);
  __cp = __s;
  if (pcVar16 == (char *)0x0) {
LAB_0038b1e0:
    iVar7 = inet_pton(10,(char *)__cp,&request_string);
    uVar12 = 0;
    uVar17 = 0x100000016;
    if (0 < iVar7) {
      uVar17 = uVar12;
    }
    if (*piVar11 != 0) {
      uVar17 = 0x100000000;
    }
    if (0 < iVar7 && pcVar16 != (char *)0x0) {
      if (((request_string._M_dataplus._M_p._1_1_ & 0xc0) == 0x80 &&
           (char)request_string._M_dataplus._M_p == -2) ||
         ((request_string._M_dataplus._M_p._1_1_ & 0xf) == 2 &&
          (char)request_string._M_dataplus._M_p == -1)) {
        uVar5 = if_nametoindex(pcVar16 + 1);
        uVar12 = (ulong)uVar5;
      }
      else {
        uVar12 = 0;
      }
      if (uVar12 == 0) {
        iVar6 = atoi(pcVar16 + 1);
        uVar12 = (ulong)iVar6;
      }
    }
  }
  else {
    __n = (long)pcVar16 - (long)__s;
    if ((long)__n < 0x40) {
      memcpy(&ip,__s,__n);
      *(undefined1 *)((long)&ip + __n) = 0;
      __cp = &ip;
      goto LAB_0038b1e0;
    }
    uVar17 = 0x100000016;
    uVar12 = 0;
    iVar7 = 0;
  }
  if (iVar7 < 1) {
    ec.val_ = 0;
    ec.failed_ = false;
    ec._5_3_ = 0;
    ec.cat_ = (error_category *)0x0;
    uVar12 = 0;
  }
  else {
    ec._0_8_ = request_string._M_dataplus._M_p;
    ec.cat_ = (error_category *)request_string._M_string_length;
  }
  if ((uVar17 & 0x100000000) == 0) {
    ip.type_ = ipv6;
    ip.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    ip.ipv6_address_.addr_.__in6_u._0_4_ = ec.val_;
    ip.ipv6_address_.addr_.__in6_u._4_1_ = ec.failed_;
    ip.ipv6_address_.addr_.__in6_u._5_3_ = ec._5_3_;
    ip.ipv6_address_.addr_.__in6_u._8_8_ = ec.cat_;
    ip.ipv6_address_.scope_id_ = uVar12;
  }
  else {
    *piVar11 = 0;
    iVar7 = inet_pton(2,(char *)__s,&ip);
    uVar17 = 0;
    if (iVar7 < 1) {
      uVar17 = 0x100000016;
    }
    if (*piVar11 == 0) {
      if (0 < iVar7) {
        ip._0_8_ = ip._0_8_ << 0x20;
        ip.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        ip.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        ip.ipv6_address_.scope_id_ = 0;
        goto LAB_0038b327;
      }
    }
    else {
      uVar17 = 0x100000000;
    }
    ip.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    ip.ipv6_address_.scope_id_ = 0;
    ip.type_ = ipv4;
    ip.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    ip.ipv6_address_.addr_.__in6_u._0_8_ = 0;
  }
LAB_0038b327:
  uVar5 = 0;
  if (((uVar17 & 0x100000000) == 0) && (ip.type_ == ipv4)) {
    boost::asio::ip::address::to_v4((address *)&request_string);
    uVar5 = (uint)request_string._M_dataplus._M_p;
  }
LAB_0038b349:
  bVar13 = 0x18;
  lVar9 = 0x54;
  do {
    buf[lVar9] = (char)((uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                        uVar5 << 0x18) >> (bVar13 & 0x1f));
    bVar13 = bVar13 - 8;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x58);
  uVar4 = (this->super_tracker_connection).m_req.key;
  bVar13 = 0x18;
  lVar9 = 0x58;
  do {
    buf[lVar9] = (char)((int)uVar4 >> (bVar13 & 0x1f));
    bVar13 = bVar13 - 8;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x5c);
  iVar7 = (this->super_tracker_connection).m_req.num_want;
  bVar13 = 0x18;
  lVar9 = 0x5c;
  do {
    buf[lVar9] = (char)(iVar7 >> (bVar13 & 0x1f));
    bVar13 = bVar13 - 8;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x60);
  uVar3 = (this->super_tracker_connection).m_req.listen_port;
  bVar13 = 8;
  lVar9 = 0x60;
  do {
    buf[lVar9] = (char)(uVar3 >> (bVar13 & 0x1f));
    bVar13 = bVar13 - 8;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x62);
  request_string._M_string_length = 0;
  request_string.field_2._M_local_buf[0] = '\0';
  ec._0_8_ = ec._0_8_ & 0xffffff0000000000;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  url._M_str = (char *)&ec;
  url._M_len = (size_t)(this->super_tracker_connection).m_req.url._M_dataplus._M_p;
  peVar15 = &ec;
  request_string._M_dataplus._M_p = (pointer)&request_string.field_2;
  parse_url_components_abi_cxx11_
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&ip,(aux *)(this->super_tracker_connection).m_req.url._M_string_length,url,in_R8);
  ::std::__cxx11::string::operator=((string *)&request_string,(string *)&ip);
  if (local_3a0[2] != (per_timer_data *)local_380) {
    operator_delete(local_3a0[2],(long)local_380[0] + 1);
  }
  if (local_3b0 != local_3a0) {
    operator_delete(local_3b0,(ulong)((long)&(local_3a0[0]->op_queue_).front_ + 1));
  }
  if (local_3d0.__d.__r != (duration)local_3c0) {
    operator_delete((void *)local_3d0.__d.__r,
                    (ulong)((long)&(local_3c0[0]->super_operation).next_ + 1));
  }
  puVar1 = (undefined1 *)((long)&ip.ipv6_address_.addr_.__in6_u + 8);
  if ((undefined1 *)ip._0_8_ != puVar1) {
    operator_delete((void *)ip._0_8_,ip.ipv6_address_.addr_.__in6_u._8_8_ + 1);
  }
  if (ec.failed_ == true) {
    request_string._M_string_length = 0;
    *request_string._M_dataplus._M_p = '\0';
  }
  if (request_string._M_string_length == 0) {
    lVar9 = 0x2be;
  }
  else {
    sVar19 = 0xff;
    if (request_string._M_string_length < 0xff) {
      sVar19 = request_string._M_string_length;
    }
    cVar18 = (char)sVar19;
    ::std::__cxx11::string::resize((ulong)&request_string,cVar18);
    sVar19 = request_string._M_string_length;
    buf[0x62] = '\x02';
    buf[99] = cVar18;
    if (request_string._M_string_length != 0) {
      memmove(buf + 100,request_string._M_dataplus._M_p,request_string._M_string_length);
    }
    lVar9 = 700 - (long)(int)sVar19;
  }
  tracker_connection::requester((tracker_connection *)&cb);
  if ((cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       != (element_type *)0x0) &&
     (iVar7 = (*(cb.
                 super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_request_callback[6])(), (char)iVar7 != '\0')) {
    in.m_len = (difference_type)peVar15;
    in.m_ptr = (char *)0x14;
    to_hex_abi_cxx11_((string *)&ip,local_368,in);
    (*(cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_vptr_request_callback[7])
              (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,"==> UDP_TRACKER_ANNOUNCE [%s]",ip._0_8_);
    if ((undefined1 *)ip._0_8_ != puVar1) {
      operator_delete((void *)ip._0_8_,ip.ipv6_address_.addr_.__in6_u._8_8_ + 1);
    }
  }
  if ((this->m_hostname)._M_string_length == 0) {
    tracker_manager::send
              ((this->super_tracker_connection).m_man,(int)this + 0x188,local_360._M_p,(size_t)buf,
               800 - (int)lVar9);
  }
  else {
    uVar3 = (this->m_target).impl_.data_.v4.sin_port;
    p.m_len = 800 - lVar9;
    p.m_ptr = buf;
    tracker_manager::send_hostname
              ((this->super_tracker_connection).m_man,
               &(this->super_tracker_connection).m_req.outgoing_socket,
               (this->m_hostname)._M_dataplus._M_p,(uint)(ushort)(uVar3 << 8 | uVar3 >> 8),p,&ec,
               (udp_send_flags_t)0x2);
  }
  this->m_state = announce;
  tracker_connection::sent_bytes(&this->super_tracker_connection,0x33c - (int)lVar9);
  this->m_attempts = this->m_attempts + 1;
  if (ec.failed_ == true) {
    fail(this,&ec,sock_write,"",(seconds32)0x0,(seconds32)0x1e);
  }
  if (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)request_string._M_dataplus._M_p != &request_string.field_2) {
    operator_delete(request_string._M_dataplus._M_p,
                    CONCAT71(request_string.field_2._M_allocated_capacity._1_7_,
                             request_string.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void udp_tracker_connection::send_udp_announce()
	{
		if (m_abort) return;

		char buf[800];
		span<char> out = buf;

		tracker_request const& req = tracker_req();
		aux::session_settings const& settings = m_man.settings();

		auto const i = m_connection_cache.find(m_target.address());
		// this isn't really supposed to happen
		TORRENT_ASSERT(i != m_connection_cache.end());
		if (i == m_connection_cache.end()) return;

		aux::write_int64(i->second.connection_id, out); // connection_id
		aux::write_int32(action_t::announce, out); // action (announce)
		aux::write_int32(m_transaction_id, out); // transaction_id
		std::copy(req.info_hash.begin(), req.info_hash.end(), out.data()); // info_hash
		out = out.subspan(20);
		std::copy(req.pid.begin(), req.pid.end(), out.data()); // peer_id
		out = out.subspan(20);
		aux::write_int64(req.downloaded, out); // downloaded
		aux::write_int64(req.left, out); // left
		aux::write_int64(req.uploaded, out); // uploaded
		aux::write_int32(req.event, out); // event
		// ip address
		address_v4 announce_ip;

		if (!settings.get_bool(settings_pack::anonymous_mode)
			&& !settings.get_str(settings_pack::announce_ip).empty())
		{
			error_code ec;
			address ip = make_address(settings.get_str(settings_pack::announce_ip).c_str(), ec);
			if (!ec && ip.is_v4()) announce_ip = ip.to_v4();
		}
		aux::write_uint32(announce_ip.to_uint(), out);
		aux::write_int32(req.key, out); // key
		aux::write_int32(req.num_want, out); // num_want
		aux::write_uint16(req.listen_port, out); // port

		std::string request_string;
		error_code ec;
		using std::ignore;
		std::tie(ignore, ignore, ignore, ignore, request_string)
			= parse_url_components(req.url, ec);
		if (ec) request_string.clear();

		if (!request_string.empty())
		{
			std::size_t str_len = std::min(request_string.size(), std::size_t(255));
			request_string.resize(str_len);

			aux::write_uint8(2, out);
			aux::write_uint8(str_len, out);
			aux::write_string(request_string, out);
		}

#ifndef TORRENT_DISABLE_LOGGING
		std::shared_ptr<request_callback> cb = requester();
		if (cb && cb->should_log())
		{
			cb->debug_log("==> UDP_TRACKER_ANNOUNCE [%s]", aux::to_hex(req.info_hash).c_str());
		}
#endif

		if (!m_hostname.empty())
		{
			m_man.send_hostname(bind_socket(), m_hostname.c_str()
				, m_target.port(), {buf, int(sizeof(buf)) - out.size()}, ec
				, udp_socket::tracker_connection);
		}
		else
		{
			m_man.send(bind_socket(), m_target, {buf, int(sizeof(buf)) - out.size()}, ec
				, udp_socket::tracker_connection);
		}
		m_state = action_t::announce;
		sent_bytes(int(sizeof(buf)) - int(out.size()) + 28); // assuming UDP/IP header
		++m_attempts;
		if (ec)
		{
			fail(ec, operation_t::sock_write);
			return;
		}
	}